

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  
  fVar2 = (this->super_Dropout).scale;
  if (fVar2 != 1.0) {
    if (bottom_top_blob->elempack != 4) {
      if (((this->super_Dropout).scale != 1.0) && (iVar15 = bottom_top_blob->c, 0 < (long)iVar15)) {
        uVar10 = bottom_top_blob->h * bottom_top_blob->w;
        pvVar11 = bottom_top_blob->data;
        sVar4 = bottom_top_blob->cstep;
        sVar5 = bottom_top_blob->elemsize;
        lVar9 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar12 = 0;
            do {
              *(float *)((long)pvVar11 + uVar12 * 4) =
                   (this->super_Dropout).scale * *(float *)((long)pvVar11 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
          lVar9 = lVar9 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
        } while (lVar9 != iVar15);
      }
      return 0;
    }
    iVar15 = bottom_top_blob->dims;
    uVar10 = bottom_top_blob->w;
    uVar3 = bottom_top_blob->h;
    if (iVar15 == 3) {
      uVar14 = bottom_top_blob->c;
      if (0 < (int)uVar14) {
        uVar12 = 0;
        do {
          if (0 < (int)(uVar3 * uVar10)) {
            pfVar13 = (float *)(bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar15 = uVar3 * uVar10;
            do {
              *pfVar13 = *pfVar13 * fVar2;
              pfVar13[1] = pfVar13[1] * fVar2;
              pfVar13[2] = pfVar13[2] * fVar2;
              pfVar13[3] = pfVar13[3] * fVar2;
              pfVar13 = pfVar13 + 4;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar14);
      }
    }
    else if (iVar15 == 2) {
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          if (0 < (int)uVar10) {
            pfVar13 = (float *)((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            uVar16 = (ulong)uVar10;
            do {
              *pfVar13 = *pfVar13 * fVar2;
              pfVar13[1] = pfVar13[1] * fVar2;
              pfVar13[2] = pfVar13[2] * fVar2;
              pfVar13[3] = pfVar13[3] * fVar2;
              pfVar13 = pfVar13 + 4;
              uVar14 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar14;
            } while (uVar14 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar3);
      }
    }
    else if ((iVar15 == 1) && (0 < (int)uVar10)) {
      lVar9 = 0;
      do {
        pfVar13 = (float *)((long)bottom_top_blob->data + lVar9);
        fVar6 = pfVar13[1];
        fVar7 = pfVar13[2];
        fVar8 = pfVar13[3];
        pfVar1 = (float *)((long)bottom_top_blob->data + lVar9);
        *pfVar1 = *pfVar13 * fVar2;
        pfVar1[1] = fVar6 * fVar2;
        pfVar1[2] = fVar7 * fVar2;
        pfVar1[3] = fVar8 * fVar2;
        lVar9 = lVar9 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar9);
    }
  }
  return 0;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}